

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PrintHeader(Hunk *this,ostream *ss)

{
  ostream *poVar1;
  ostream *ss_local;
  Hunk *this_local;
  
  std::operator<<(ss,"@@ ");
  if (this->removes_ != 0) {
    poVar1 = std::operator<<(ss,"-");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->left_start_);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,this->removes_ + this->common_);
  }
  if ((this->removes_ != 0) && (this->adds_ != 0)) {
    std::operator<<(ss," ");
  }
  if (this->adds_ != 0) {
    poVar1 = std::operator<<(ss,"+");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->right_start_);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,this->adds_ + this->common_);
  }
  std::operator<<(ss," @@\n");
  return;
}

Assistant:

void PrintHeader(std::ostream* ss) const {
    *ss << "@@ ";
    if (removes_) {
      *ss << "-" << left_start_ << "," << (removes_ + common_);
    }
    if (removes_ && adds_) {
      *ss << " ";
    }
    if (adds_) {
      *ss << "+" << right_start_ << "," << (adds_ + common_);
    }
    *ss << " @@\n";
  }